

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O1

OPJ_BOOL opj_jp2_check_color(opj_image_t *image,opj_jp2_color_t *color,opj_event_mgr_t *p_manager)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  OPJ_UINT16 OVar4;
  ushort uVar5;
  opj_jp2_cdef_t *poVar6;
  opj_jp2_pclr_t *poVar7;
  opj_jp2_cmap_comp_t *poVar8;
  bool bVar9;
  void *ptr;
  long lVar10;
  OPJ_UINT16 OVar11;
  char *pcVar12;
  OPJ_BOOL OVar13;
  OPJ_UINT16 *pOVar14;
  OPJ_UINT32 OVar15;
  ulong uVar16;
  OPJ_UINT16 OVar17;
  opj_jp2_cdef_info_t *poVar18;
  ulong uVar19;
  ulong num;
  
  poVar6 = color->jp2_cdef;
  if (poVar6 != (opj_jp2_cdef_t *)0x0) {
    OVar4 = poVar6->n;
    OVar15 = image->numcomps;
    poVar7 = color->jp2_pclr;
    if ((poVar7 != (opj_jp2_pclr_t *)0x0) && (poVar7->cmap != (opj_jp2_cmap_comp_t *)0x0)) {
      OVar15 = (OPJ_UINT32)poVar7->nr_channels;
    }
    if (OVar4 != 0) {
      pOVar14 = &poVar6->info->asoc;
      OVar17 = OVar4;
      do {
        if ((OVar15 <= ((opj_jp2_cdef_info_t *)(pOVar14 + -2))->cn) ||
           (((uVar5 = *pOVar14, uVar5 != 0 && (uVar5 != 0xffff)) && (OVar15 <= uVar5 - 1)))) {
          opj_event_msg(p_manager,1,"Invalid component index %d (>= %d).\n");
          return 0;
        }
        pOVar14 = pOVar14 + 3;
        OVar17 = OVar17 - 1;
      } while (OVar17 != 0);
    }
    for (; OVar15 != 0; OVar15 = OVar15 - 1) {
      if (OVar4 == 0) {
        OVar17 = 0;
      }
      else {
        OVar11 = 0;
        poVar18 = poVar6->info;
        do {
          OVar17 = OVar11;
          if (OVar15 - 1 == (uint)poVar18->cn) break;
          OVar11 = OVar11 + 1;
          poVar18 = poVar18 + 1;
          OVar17 = OVar4;
        } while (OVar4 != OVar11);
      }
      if (OVar17 == OVar4) {
        pcVar12 = "Incomplete channel definitions.\n";
        goto LAB_0011ce88;
      }
    }
  }
  poVar7 = color->jp2_pclr;
  if ((poVar7 == (opj_jp2_pclr_t *)0x0) ||
     (poVar8 = poVar7->cmap, poVar8 == (opj_jp2_cmap_comp_t *)0x0)) {
LAB_0011cede:
    OVar13 = 1;
  }
  else {
    bVar1 = poVar7->nr_channels;
    num = (ulong)bVar1;
    bVar9 = true;
    if (num != 0) {
      uVar19 = 0;
      do {
        if (image->numcomps <= (uint)poVar8[uVar19].cmp) {
          bVar9 = false;
          opj_event_msg(p_manager,1,"Invalid component index %d (>= %d).\n");
        }
        uVar19 = uVar19 + 1;
      } while (num != uVar19);
    }
    ptr = opj_calloc(num,4);
    if (ptr == (void *)0x0) {
      pcVar12 = "Unexpected OOM.\n";
LAB_0011ce88:
      opj_event_msg(p_manager,1,pcVar12);
      return 0;
    }
    if (num != 0) {
      uVar19 = 0;
      do {
        bVar2 = poVar8[uVar19].mtyp;
        uVar16 = (ulong)bVar2;
        if (bVar2 < 2) {
          bVar3 = poVar8[uVar19].pcol;
          uVar16 = (ulong)bVar3;
          if (bVar3 < bVar1) {
            if ((bVar2 != 1) || (*(int *)((long)ptr + uVar16 * 4) == 0)) {
              if ((bVar2 == 0) && (bVar3 != 0)) {
                pcVar12 = "Direct use at #%d however pcol=%d.\n";
                goto LAB_0011cd43;
              }
              if ((bVar2 == 1) && ((uint)uVar19 != (uint)bVar3)) {
                bVar9 = false;
                opj_event_msg(p_manager,1,
                              "Implementation limitation: for palette mapping, pcol[%d] should be equal to %d, but is equal to %d.\n"
                              ,uVar19 & 0xffffffff,uVar19 & 0xffffffff);
              }
              else {
                *(undefined4 *)((long)ptr + uVar16 * 4) = 1;
              }
              goto LAB_0011cd94;
            }
            pcVar12 = "Component %d is mapped twice.\n";
          }
          else {
            pcVar12 = "Invalid component/palette index for direct mapping %d.\n";
          }
          bVar9 = false;
          opj_event_msg(p_manager,1,pcVar12,uVar16);
        }
        else {
          pcVar12 = "Invalid value for cmap[%d].mtyp = %d.\n";
LAB_0011cd43:
          bVar9 = false;
          opj_event_msg(p_manager,1,pcVar12,uVar19 & 0xffffffff,uVar16);
        }
LAB_0011cd94:
        uVar19 = uVar19 + 1;
      } while (num != uVar19);
    }
    if (num != 0) {
      uVar19 = 0;
      do {
        if ((*(int *)((long)ptr + uVar19 * 4) == 0) && (poVar8[uVar19].mtyp != '\0')) {
          bVar9 = false;
          opj_event_msg(p_manager,1,"Component %d doesn\'t have a mapping.\n",uVar19 & 0xffffffff);
        }
        uVar19 = uVar19 + 1;
      } while (num != uVar19);
    }
    if (bVar9) {
      if ((image->numcomps == 1) && (bVar1 != 0)) {
        lVar10 = 0;
LAB_0011ce66:
        if (*(int *)((long)ptr + lVar10 * 4) != 0) goto code_r0x0011ce6d;
        uVar19 = 0;
        opj_event_msg(p_manager,2,"Component mapping seems wrong. Trying to correct.\n");
        do {
          poVar8[uVar19].mtyp = '\x01';
          poVar8[uVar19].pcol = (OPJ_BYTE)uVar19;
          uVar19 = uVar19 + 1;
        } while (num != uVar19);
      }
LAB_0011ced1:
      opj_free(ptr);
      if (bVar9) goto LAB_0011cede;
    }
    else {
      opj_free(ptr);
    }
    OVar13 = 0;
  }
  return OVar13;
code_r0x0011ce6d:
  lVar10 = lVar10 + 1;
  if ((ushort)bVar1 == (ushort)lVar10) goto LAB_0011ced1;
  goto LAB_0011ce66;
}

Assistant:

static OPJ_BOOL opj_jp2_check_color(opj_image_t *image, opj_jp2_color_t *color,
                                    opj_event_mgr_t *p_manager)
{
    OPJ_UINT16 i;

    /* testcase 4149.pdf.SIGSEGV.cf7.3501 */
    if (color->jp2_cdef) {
        opj_jp2_cdef_info_t *info = color->jp2_cdef->info;
        OPJ_UINT16 n = color->jp2_cdef->n;
        OPJ_UINT32 nr_channels =
            image->numcomps; /* FIXME image->numcomps == jp2->numcomps before color is applied ??? */

        /* cdef applies to cmap channels if any */
        if (color->jp2_pclr && color->jp2_pclr->cmap) {
            nr_channels = (OPJ_UINT32)color->jp2_pclr->nr_channels;
        }

        for (i = 0; i < n; i++) {
            if (info[i].cn >= nr_channels) {
                opj_event_msg(p_manager, EVT_ERROR, "Invalid component index %d (>= %d).\n",
                              info[i].cn, nr_channels);
                return OPJ_FALSE;
            }
            if (info[i].asoc == 65535U) {
                continue;
            }

            if (info[i].asoc > 0 && (OPJ_UINT32)(info[i].asoc - 1) >= nr_channels) {
                opj_event_msg(p_manager, EVT_ERROR, "Invalid component index %d (>= %d).\n",
                              info[i].asoc - 1, nr_channels);
                return OPJ_FALSE;
            }
        }

        /* issue 397 */
        /* ISO 15444-1 states that if cdef is present, it shall contain a complete list of channel definitions. */
        while (nr_channels > 0) {
            for (i = 0; i < n; ++i) {
                if ((OPJ_UINT32)info[i].cn == (nr_channels - 1U)) {
                    break;
                }
            }
            if (i == n) {
                opj_event_msg(p_manager, EVT_ERROR, "Incomplete channel definitions.\n");
                return OPJ_FALSE;
            }
            --nr_channels;
        }
    }

    /* testcases 451.pdf.SIGSEGV.f4c.3723, 451.pdf.SIGSEGV.5b5.3723 and
       66ea31acbb0f23a2bbc91f64d69a03f5_signal_sigsegv_13937c0_7030_5725.pdf */
    if (color->jp2_pclr && color->jp2_pclr->cmap) {
        OPJ_UINT16 nr_channels = color->jp2_pclr->nr_channels;
        opj_jp2_cmap_comp_t *cmap = color->jp2_pclr->cmap;
        OPJ_BOOL *pcol_usage, is_sane = OPJ_TRUE;

        /* verify that all original components match an existing one */
        for (i = 0; i < nr_channels; i++) {
            if (cmap[i].cmp >= image->numcomps) {
                opj_event_msg(p_manager, EVT_ERROR, "Invalid component index %d (>= %d).\n",
                              cmap[i].cmp, image->numcomps);
                is_sane = OPJ_FALSE;
            }
        }

        pcol_usage = (OPJ_BOOL *) opj_calloc(nr_channels, sizeof(OPJ_BOOL));
        if (!pcol_usage) {
            opj_event_msg(p_manager, EVT_ERROR, "Unexpected OOM.\n");
            return OPJ_FALSE;
        }
        /* verify that no component is targeted more than once */
        for (i = 0; i < nr_channels; i++) {
            OPJ_BYTE mtyp = cmap[i].mtyp;
            OPJ_BYTE pcol = cmap[i].pcol;
            /* See ISO 15444-1 Table I.14 – MTYPi field values */
            if (mtyp != 0 && mtyp != 1) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Invalid value for cmap[%d].mtyp = %d.\n", i,
                              mtyp);
                is_sane = OPJ_FALSE;
            } else if (pcol >= nr_channels) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Invalid component/palette index for direct mapping %d.\n", pcol);
                is_sane = OPJ_FALSE;
            } else if (pcol_usage[pcol] && mtyp == 1) {
                opj_event_msg(p_manager, EVT_ERROR, "Component %d is mapped twice.\n", pcol);
                is_sane = OPJ_FALSE;
            } else if (mtyp == 0 && pcol != 0) {
                /* I.5.3.5 PCOL: If the value of the MTYP field for this channel is 0, then
                 * the value of this field shall be 0. */
                opj_event_msg(p_manager, EVT_ERROR, "Direct use at #%d however pcol=%d.\n", i,
                              pcol);
                is_sane = OPJ_FALSE;
            } else if (mtyp == 1 && pcol != i) {
                /* OpenJPEG implementation limitation. See assert(i == pcol); */
                /* in opj_jp2_apply_pclr() */
                opj_event_msg(p_manager, EVT_ERROR,
                              "Implementation limitation: for palette mapping, "
                              "pcol[%d] should be equal to %d, but is equal "
                              "to %d.\n", i, i, pcol);
                is_sane = OPJ_FALSE;
            } else {
                pcol_usage[pcol] = OPJ_TRUE;
            }
        }
        /* verify that all components are targeted at least once */
        for (i = 0; i < nr_channels; i++) {
            if (!pcol_usage[i] && cmap[i].mtyp != 0) {
                opj_event_msg(p_manager, EVT_ERROR, "Component %d doesn't have a mapping.\n",
                              i);
                is_sane = OPJ_FALSE;
            }
        }
        /* Issue 235/447 weird cmap */
        if (1 && is_sane && (image->numcomps == 1U)) {
            for (i = 0; i < nr_channels; i++) {
                if (!pcol_usage[i]) {
                    is_sane = 0U;
                    opj_event_msg(p_manager, EVT_WARNING,
                                  "Component mapping seems wrong. Trying to correct.\n");
                    break;
                }
            }
            if (!is_sane) {
                is_sane = OPJ_TRUE;
                for (i = 0; i < nr_channels; i++) {
                    cmap[i].mtyp = 1U;
                    cmap[i].pcol = (OPJ_BYTE) i;
                }
            }
        }
        opj_free(pcol_usage);
        if (!is_sane) {
            return OPJ_FALSE;
        }
    }

    return OPJ_TRUE;
}